

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSimBase.c
# Opt level: O3

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2(Gia_Man_t *p,Vec_Wrd_t *vRel,int nOuts)

{
  uint uVar1;
  int w;
  uint uVar2;
  Vec_Wrd_t *vFuncs;
  word *__s;
  ulong uVar3;
  ulong uVar4;
  byte bVar5;
  int Count;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  char *p_00;
  long lVar14;
  uint uVar15;
  long lVar16;
  uint uVar17;
  ulong uVar18;
  ulong uVar19;
  word *pwVar20;
  int nDCs [32];
  int local_100;
  int local_b8 [34];
  
  local_b8[0x1c] = 0;
  local_b8[0x1d] = 0;
  local_b8[0x1e] = 0;
  local_b8[0x1f] = 0;
  local_b8[0x18] = 0;
  local_b8[0x19] = 0;
  local_b8[0x1a] = 0;
  local_b8[0x1b] = 0;
  local_b8[0x14] = 0;
  local_b8[0x15] = 0;
  local_b8[0x16] = 0;
  local_b8[0x17] = 0;
  local_b8[0x10] = 0;
  local_b8[0x11] = 0;
  local_b8[0x12] = 0;
  local_b8[0x13] = 0;
  local_b8[0xc] = 0;
  local_b8[0xd] = 0;
  local_b8[0xe] = 0;
  local_b8[0xf] = 0;
  local_b8[8] = 0;
  local_b8[9] = 0;
  local_b8[10] = 0;
  local_b8[0xb] = 0;
  local_b8[4] = 0;
  local_b8[5] = 0;
  local_b8[6] = 0;
  local_b8[7] = 0;
  local_b8[0] = 0;
  local_b8[1] = 0;
  local_b8[2] = 0;
  local_b8[3] = 0;
  bVar5 = (byte)nOuts;
  uVar13 = 1 << (bVar5 & 0x1f);
  uVar15 = vRel->nSize;
  uVar2 = (int)uVar15 / (int)uVar13;
  uVar1 = nOuts * uVar2 * 2;
  vFuncs = (Vec_Wrd_t *)malloc(0x10);
  uVar17 = 0x10;
  if (0xe < nOuts * uVar2 * 2 - 1) {
    uVar17 = uVar1;
  }
  vFuncs->nCap = uVar17;
  if (uVar17 == 0) {
    __s = (word *)0x0;
  }
  else {
    __s = (word *)malloc((long)(int)uVar17 << 3);
  }
  vFuncs->pArray = __s;
  vFuncs->nSize = uVar1;
  uVar3 = (ulong)(int)uVar1;
  memset(__s,0,uVar3 * 8);
  if ((uVar15 & uVar13 - 1) != 0) {
    __assert_fail("Vec_WrdSize(vRel) % nMints == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x332,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  if (0x20 < nOuts) {
    __assert_fail("nOuts <= 32",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaSimBase.c"
                  ,0x333,"Vec_Wrd_t *Gia_ManSimRelDeriveFuncs2(Gia_Man_t *, Vec_Wrd_t *, int)");
  }
  iVar9 = uVar2 * 0x40;
  uVar11 = (ulong)uVar2;
  if (0 < (int)uVar2) {
    uVar15 = 1;
    if (1 < (int)uVar13) {
      uVar15 = uVar13;
    }
    iVar6 = 1;
    if (1 < iVar9) {
      iVar6 = iVar9;
    }
    uVar4 = 0;
    local_100 = 0;
    do {
      if (nOuts == 0x1f) {
        uVar12 = 0;
LAB_007c4c93:
        uVar19 = 1L << ((byte)uVar4 & 0x3f);
        pwVar20 = vRel->pArray;
        uVar10 = 0;
        uVar8 = 0;
        do {
          uVar17 = (uVar12 ^ 1 << ((uint)uVar8 & 0x1f)) + ((int)uVar4 << (bVar5 & 0x1f));
          if ((pwVar20[(int)uVar17 >> 6] >> ((ulong)uVar17 & 0x3f) & 1) == 0) {
            if ((1 << ((byte)uVar8 & 0x1f) & uVar12) == 0) {
              if (uVar1 <= uVar10) goto LAB_007c4f7f;
              __s[(uVar4 >> 6) + uVar10] = __s[(uVar4 >> 6) + uVar10] | uVar19;
            }
            else {
              if ((ulong)uVar1 <= uVar10 + uVar11) goto LAB_007c4f7f;
              __s[uVar11 + (uVar4 >> 6) + uVar10] = __s[uVar11 + (uVar4 >> 6) + uVar10] | uVar19;
            }
          }
          else {
            local_b8[uVar8] = local_b8[uVar8] + 1;
          }
          uVar8 = uVar8 + 1;
          uVar10 = uVar10 + uVar11 * 2;
        } while ((uint)nOuts != uVar8);
      }
      else {
        uVar17 = 0;
        do {
          uVar7 = ((int)uVar4 << (bVar5 & 0x1f)) + uVar17;
          uVar12 = uVar17;
          if ((vRel->pArray[(int)uVar7 >> 6] >> ((ulong)uVar7 & 0x3f) & 1) != 0) break;
          uVar17 = uVar17 + 1;
          uVar12 = uVar15;
        } while (uVar15 != uVar17);
        local_100 = local_100 + (uint)(uVar12 == uVar13);
        if (0 < nOuts) goto LAB_007c4c93;
      }
      uVar4 = uVar4 + 1;
    } while ((int)uVar4 != iVar6);
    if (local_100 != 0) {
      p_00 = "The relation is not well-defined for %d (out of %d) patterns.\n";
      printf("The relation is not well-defined for %d (out of %d) patterns.\n");
      goto LAB_007c4f55;
    }
  }
  printf("The relation was successfully determized with don\'t-cares for %d patterns.\n");
  if (0 < nOuts) {
    lVar16 = (long)(int)uVar2;
    pwVar20 = __s + lVar16;
    uVar4 = 0;
    do {
      uVar8 = uVar4 * 2;
      if (((long)(uVar8 * lVar16) < 0) || ((long)uVar3 <= (long)(uVar8 * lVar16))) {
LAB_007c4f7f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((int)uVar2 < 1) {
        lVar14 = (uVar8 | 1) * lVar16;
        if ((lVar14 < 0) || ((long)uVar3 <= lVar14)) goto LAB_007c4f7f;
        uVar10 = 0;
LAB_007c4eea:
        uVar8 = 0;
      }
      else {
        uVar19 = 0;
        uVar10 = 0;
        do {
          uVar18 = __s[uVar19] - (__s[uVar19] >> 1 & 0x5555555555555555);
          uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
          uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f;
          uVar18 = (uVar18 >> 8) + uVar18;
          lVar14 = (uVar18 >> 0x10) + uVar18;
          uVar10 = (ulong)((int)uVar10 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU));
          uVar19 = uVar19 + 1;
        } while (uVar11 != uVar19);
        if (uVar3 <= (uVar8 | 1) * lVar16) goto LAB_007c4f7f;
        if ((int)uVar2 < 1) goto LAB_007c4eea;
        uVar19 = 0;
        uVar8 = 0;
        do {
          uVar18 = pwVar20[uVar19] - (pwVar20[uVar19] >> 1 & 0x5555555555555555);
          uVar18 = (uVar18 >> 2 & 0x3333333333333333) + (uVar18 & 0x3333333333333333);
          uVar18 = (uVar18 >> 4) + uVar18 & 0xf0f0f0f0f0f0f0f;
          uVar18 = (uVar18 >> 8) + uVar18;
          lVar14 = (uVar18 >> 0x10) + uVar18;
          uVar8 = (ulong)((int)uVar8 + ((int)((ulong)lVar14 >> 0x20) + (int)lVar14 & 0xffU));
          uVar19 = uVar19 + 1;
        } while (uVar11 != uVar19);
      }
      printf("%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n",
             SUB84(((double)local_b8[uVar4] * 100.0) / (double)iVar9,0),uVar4,uVar10,uVar8);
      uVar4 = uVar4 + 1;
      __s = __s + lVar16 * 2;
      pwVar20 = pwVar20 + lVar16 * 2;
    } while (uVar4 != (uint)nOuts);
  }
  p_00 = (char *)0xa;
  putchar(10);
LAB_007c4f55:
  Gia_ManSimRelCheckFuncs((Gia_Man_t *)p_00,vRel,nOuts,vFuncs);
  return vFuncs;
}

Assistant:

Vec_Wrd_t * Gia_ManSimRelDeriveFuncs2( Gia_Man_t * p, Vec_Wrd_t * vRel, int nOuts )
{
    int i, k, m, nDCs[32] = {0}, Count = 0, nMints = 1 << nOuts, nWords = Vec_WrdSize(vRel) / nMints;
    Vec_Wrd_t * vFuncs = Vec_WrdStart( 2 * nOuts * nWords );
    assert( Vec_WrdSize(vRel) % nMints == 0 );
    assert( nOuts <= 32 );
    for ( i = 0; i < 64 * nWords; i++ )
    {
        for ( m = 0; m < nMints; m++ )
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) )
                break;
        Count += m == nMints;
        for ( k = 0; k < nOuts; k++ )
        {
            if ( Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+(m^(1<<k)) ) )
            {
                nDCs[k]++;
                continue;
            }
            if ( (m >> k) & 1 )
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i );
            else
                Abc_TtSetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i );
        }
        if ( 0 )
        {
            for ( m = 0; m < nMints; m++ )
                printf( "%d", Abc_TtGetBit( Vec_WrdArray(vRel), i*nMints+m ) );
            printf( " " );
            for ( k = 0; k < nOuts; k++ )
            {
                if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), i ) )
                    printf( "0" );
                else if ( Abc_TtGetBit( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), i ) )
                    printf( "1" );
                else
                    printf( "-" );
            }
            printf( "\n" );
        }
    }
    if ( Count )
        printf( "The relation is not well-defined for %d (out of %d) patterns.\n", Count, 64 * nWords );
    else
    {
        printf( "The relation was successfully determized with don't-cares for %d patterns.\n", 64 * nWords );
        for ( k = 0; k < nOuts; k++ )
        {
            int nOffs = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+0)*nWords), nWords );
            int nOns  = Abc_TtCountOnesVec( Vec_WrdEntryP(vFuncs, (2*k+1)*nWords), nWords );
            printf( "%4d : Off = %6d  On = %6d  Dc = %6d (%6.2f %%)\n", k, nOffs, nOns, nDCs[k], 100.0*nDCs[k]/(64*nWords) );
        }
        printf( "\n" );
    }
    Gia_ManSimRelCheckFuncs( p, vRel, nOuts, vFuncs );
    return vFuncs;
}